

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  PolicyStatus PVar1;
  PolicyStatus id_00;
  PolicyStatus id_01;
  string msg;
  string local_40;
  
  id_01 = status;
  if ((status != NEW) &&
     (PVar1 = cmPolicies::GetPolicyStatus(id), id_01 = id_00, PVar1 == REQUIRED_ALWAYS)) {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_(&local_40,(cmPolicies *)(ulong)id,id_00);
    IssueMessage(this,FATAL_ERROR,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  if ((int)id < 0x25 && status == OLD) {
    cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_(&local_40,(cmPolicies *)(ulong)id,id_01);
    IssueMessage(this,DEPRECATION_WARNING,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  cmStateSnapshot::SetPolicy(&this->StateSnapshot,id,status);
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(cmake::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies, especially those that require a lot
  // of code to maintain the old behavior.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0036) {
    this->IssueMessage(cmake::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}